

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool __thiscall
cmStringCommand::HandleRegexCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  string e;
  string mode;
  allocator local_59;
  string local_58;
  string local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    std::__cxx11::string::string
              ((string *)&local_38,"sub-command REGEX requires a mode to be specified.",
               (allocator *)&local_58);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    return false;
  }
  std::__cxx11::string::string((string *)&local_38,(string *)(pbVar1 + 1));
  bVar2 = std::operator==(&local_38,"MATCH");
  if (bVar2) {
    if (0x80 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      bVar2 = RegexMatch(this,args);
      goto LAB_002b2a28;
    }
    std::__cxx11::string::string
              ((string *)&local_58,
               "sub-command REGEX, mode MATCH needs at least 5 arguments total to command.",
               &local_59);
    cmCommand::SetError(&this->super_cmCommand,&local_58);
  }
  else {
    bVar2 = std::operator==(&local_38,"MATCHALL");
    if (bVar2) {
      if (0x80 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)) {
        bVar2 = RegexMatchAll(this,args);
        goto LAB_002b2a28;
      }
      std::__cxx11::string::string
                ((string *)&local_58,
                 "sub-command REGEX, mode MATCHALL needs at least 5 arguments total to command.",
                 &local_59);
      cmCommand::SetError(&this->super_cmCommand,&local_58);
    }
    else {
      bVar2 = std::operator==(&local_38,"REPLACE");
      if (bVar2) {
        if (0xbf < (ulong)((long)(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start)) {
          bVar2 = RegexReplace(this,args);
          goto LAB_002b2a28;
        }
        std::__cxx11::string::string
                  ((string *)&local_58,
                   "sub-command REGEX, mode REPLACE needs at least 6 arguments total to command.",
                   &local_59);
        cmCommand::SetError(&this->super_cmCommand,&local_58);
      }
      else {
        std::operator+(&local_58,"sub-command REGEX does not recognize mode ",&local_38);
        cmCommand::SetError(&this->super_cmCommand,&local_58);
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_58);
  bVar2 = false;
LAB_002b2a28:
  std::__cxx11::string::~string((string *)&local_38);
  return bVar2;
}

Assistant:

bool cmStringCommand::HandleRegexCommand(std::vector<std::string> const& args)
{
  if(args.size() < 2)
    {
    this->SetError("sub-command REGEX requires a mode to be specified.");
    return false;
    }
  std::string mode = args[1];
  if(mode == "MATCH")
    {
    if(args.size() < 5)
      {
      this->SetError("sub-command REGEX, mode MATCH needs "
                     "at least 5 arguments total to command.");
      return false;
      }
    return this->RegexMatch(args);
    }
  else if(mode == "MATCHALL")
    {
    if(args.size() < 5)
      {
      this->SetError("sub-command REGEX, mode MATCHALL needs "
                     "at least 5 arguments total to command.");
      return false;
      }
    return this->RegexMatchAll(args);
    }
  else if(mode == "REPLACE")
    {
    if(args.size() < 6)
      {
      this->SetError("sub-command REGEX, mode REPLACE needs "
                     "at least 6 arguments total to command.");
      return false;
      }
    return this->RegexReplace(args);
    }

  std::string e = "sub-command REGEX does not recognize mode "+mode;
  this->SetError(e);
  return false;
}